

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void line_attempt_4(int x0,int y0,int x1,int y1,TGAImage *image,TGAColor color)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  float extraout_XMM0_Da;
  int local_44;
  int local_40;
  int x;
  int y;
  float error;
  float derror;
  int dy;
  int dx;
  bool steep;
  TGAImage *image_local;
  int y1_local;
  int x1_local;
  int y0_local;
  int x0_local;
  TGAColor color_local;
  
  register0x00000000 = color.bgra;
  x0_local._3_1_ = color.bytespp;
  iVar1 = x0 - x1;
  if (iVar1 < 1) {
    iVar1 = -iVar1;
  }
  iVar3 = y0 - y1;
  if (iVar3 < 1) {
    iVar3 = -iVar3;
  }
  image_local._0_4_ = y1;
  image_local._4_4_ = x1;
  y1_local = y0;
  x1_local = x0;
  if (iVar1 < iVar3) {
    std::swap<int>(&x1_local,&y1_local);
    piVar4 = (int *)((long)&image_local + 4);
    std::swap<int>(piVar4,(int *)&image_local);
    x0 = (int)piVar4;
  }
  if (image_local._4_4_ < x1_local) {
    std::swap<int>(&x1_local,(int *)((long)&image_local + 4));
    piVar4 = &y1_local;
    std::swap<int>(piVar4,(int *)&image_local);
    x0 = (int)piVar4;
  }
  std::abs(x0);
  x = 0;
  local_40 = y1_local;
  for (local_44 = x1_local; local_44 <= image_local._4_4_; local_44 = local_44 + 1) {
    if (iVar1 < iVar3) {
      TGAImage::set(image,(long)local_40,(long)local_44,(TGAColor *)((long)&y0_local + 3));
    }
    else {
      TGAImage::set(image,(long)local_44,(long)local_40,(TGAColor *)((long)&y0_local + 3));
    }
    x = (int)(extraout_XMM0_Da + (float)x);
    if (0.5 < (float)x) {
      iVar2 = -1;
      if (y1_local < (int)image_local) {
        iVar2 = 1;
      }
      local_40 = iVar2 + local_40;
      x = (int)((float)x - 1.0);
    }
  }
  return;
}

Assistant:

void line_attempt_4(int x0, int y0, int x1, int y1, TGAImage &image, TGAColor color)
{
    bool steep = false;
    if (std::abs(x0 - x1) < std::abs(y0 - y1)) {
        std::swap(x0, y0);
        std::swap(x1, y1);
        steep = true;
    }
    if (x0 > x1) {
        std::swap(x0, x1);
        std::swap(y0, y1);
    }
    int dx = x1 - x0;
    int dy = y1 - y0;
    float derror = std::abs(static_cast<float>(dy) / static_cast<float>(dx));
    float error = 0;
    int y = y0;
    for (int x = x0; x <= x1; x++) {
        if (steep) {
            image.set(y, x, color);
        } else {
            image.set(x, y, color);
        }
        error += derror;
        if (error > .5f) {
            y += (y1 > y0 ? 1 : -1);
            error -= 1.f;
        }
    }
}